

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  int iVar3;
  char *s1;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined1 auVar8 [32];
  bool bVar9;
  uint uVar10;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  __m256i *palVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  ulong uVar16;
  parasail_result_t *result_00;
  __m256i *b;
  __m256i *palVar17;
  __m256i *b_00;
  __m256i *palVar18;
  __m256i *b_01;
  __m256i *palVar19;
  __m256i *b_02;
  __m256i *palVar20;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *palVar21;
  __m256i *palVar22;
  __m256i *ptr;
  longlong lVar23;
  int iVar24;
  longlong lVar25;
  ulong uVar26;
  __m256i *palVar27;
  __m256i *palVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  __m256i *palVar32;
  long lVar33;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *palVar34;
  __m256i *ptr_02;
  undefined1 auVar35 [16];
  undefined1 auVar41 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [16];
  undefined1 auVar48 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar58 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  __m256i *palVar71;
  __m256i *ptr_03;
  ulong local_268;
  __m256i *local_260;
  long local_208;
  longlong local_1d8;
  undefined1 local_168 [32];
  __m256i *local_d8;
  
  s1 = profile->s1;
  ppVar4 = profile->matrix;
  result = parasail_sw_striped_profile_avx2_256_64(profile,s2,s2Len,open,gap);
  iVar12 = parasail_result_is_saturated(result);
  if (iVar12 != 0) {
    return result;
  }
  iVar12 = result->end_query;
  iVar3 = result->end_ref;
  profile_00 = parasail_profile_create_stats_avx_256_64(s1,iVar12 + 1,ppVar4);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar5 = (profile_00->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_stats_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile_00->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar30 = profile_00->s1Len;
        uVar16 = (ulong)uVar30;
        if ((int)uVar30 < 1) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_4();
        }
        else if (iVar3 < 0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_1();
        }
        else {
          pvVar6 = (profile_00->profile64).matches;
          pvVar7 = (profile_00->profile64).similar;
          iVar14 = ppVar4->max;
          result_00 = parasail_result_new_stats();
          if (result_00 != (parasail_result_t *)0x0) {
            uVar26 = uVar16 + 3 >> 2;
            result_00->flag = result_00->flag | 0x4810804;
            b = parasail_memalign___m256i(0x20,uVar26);
            palVar17 = parasail_memalign___m256i(0x20,uVar26);
            b_00 = parasail_memalign___m256i(0x20,uVar26);
            palVar18 = parasail_memalign___m256i(0x20,uVar26);
            b_01 = parasail_memalign___m256i(0x20,uVar26);
            palVar19 = parasail_memalign___m256i(0x20,uVar26);
            b_02 = parasail_memalign___m256i(0x20,uVar26);
            palVar20 = parasail_memalign___m256i(0x20,uVar26);
            b_03 = parasail_memalign___m256i(0x20,uVar26);
            b_04 = parasail_memalign___m256i(0x20,uVar26);
            b_05 = parasail_memalign___m256i(0x20,uVar26);
            b_06 = parasail_memalign___m256i(0x20,uVar26);
            local_260 = parasail_memalign___m256i(0x20,uVar26);
            palVar21 = parasail_memalign___m256i(0x20,uVar26);
            palVar22 = parasail_memalign___m256i(0x20,uVar26);
            ptr = parasail_memalign___m256i(0x20,uVar26);
            auVar57._8_8_ = 0;
            auVar57._0_8_ = b;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = palVar17;
            auVar57 = vpunpcklqdq_avx(auVar57,auVar59);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = b_00;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = palVar18;
            auVar59 = vpunpcklqdq_avx(auVar35,auVar41);
            auVar35 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar57;
            auVar41 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = b_01;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = palVar19;
            auVar57 = vpunpcklqdq_avx(auVar42,auVar48);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b_02;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = palVar20;
            auVar59 = vpunpcklqdq_avx(auVar49,auVar53);
            auVar42 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar57;
            auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_03;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b_04;
            auVar57 = vpunpcklqdq_avx(auVar52,auVar54);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = b_05;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = b_06;
            auVar59 = vpunpcklqdq_avx(auVar55,auVar60);
            auVar49 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar57;
            auVar52 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = local_260;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = palVar21;
            auVar57 = vpunpcklqdq_avx(auVar56,auVar61);
            auVar62._8_8_ = 0;
            auVar62._0_8_ = palVar22;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = ptr;
            auVar59 = vpunpcklqdq_avx(auVar62,auVar64);
            auVar57 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar57;
            auVar59 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
            auVar36._0_8_ = -(ulong)(auVar35._0_8_ == 0);
            auVar36._8_8_ = -(ulong)(auVar35._8_8_ == 0);
            auVar36._16_8_ = -(ulong)(auVar41._0_8_ == 0);
            auVar36._24_8_ = -(ulong)(auVar41._8_8_ == 0);
            auVar43._0_8_ = -(ulong)(auVar42._0_8_ == 0);
            auVar43._8_8_ = -(ulong)(auVar42._8_8_ == 0);
            auVar43._16_8_ = -(ulong)(auVar48._0_8_ == 0);
            auVar43._24_8_ = -(ulong)(auVar48._8_8_ == 0);
            auVar36 = vpackssdw_avx2(auVar36,auVar43);
            auVar43 = vpermq_avx2(auVar36,0xd8);
            auVar44._0_8_ = -(ulong)(auVar49._0_8_ == 0);
            auVar44._8_8_ = -(ulong)(auVar49._8_8_ == 0);
            auVar44._16_8_ = -(ulong)(auVar52._0_8_ == 0);
            auVar44._24_8_ = -(ulong)(auVar52._8_8_ == 0);
            auVar50._0_8_ = -(ulong)(auVar57._0_8_ == 0);
            auVar50._8_8_ = -(ulong)(auVar57._8_8_ == 0);
            auVar50._16_8_ = -(ulong)(auVar59._0_8_ == 0);
            auVar50._24_8_ = -(ulong)(auVar59._8_8_ == 0);
            auVar36 = vpackssdw_avx2(auVar44,auVar50);
            auVar36 = vpermq_avx2(auVar36,0xd8);
            auVar36 = vpackssdw_avx2(auVar43,auVar36);
            if ((((((((((((((((auVar36 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar36 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar36 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar36 >> 0x7f,0) == '\0') &&
                      (auVar36 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar36 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar36 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar36 >> 0xbf,0) == '\0') &&
                  (auVar36 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar36 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar36 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                -1 < auVar36[0x1f]) {
              local_268 = 0;
              auVar37._4_4_ = 0;
              auVar37._0_4_ = open;
              auVar37._8_4_ = open;
              auVar37._12_4_ = 0;
              auVar37._16_4_ = open;
              auVar37._20_4_ = 0;
              auVar37._24_4_ = open;
              auVar37._28_4_ = 0;
              auVar38._4_4_ = 0;
              auVar38._0_4_ = gap;
              auVar38._8_4_ = gap;
              auVar38._12_4_ = 0;
              auVar38._16_4_ = gap;
              auVar38._20_4_ = 0;
              auVar38._24_4_ = gap;
              auVar38._28_4_ = 0;
              alVar1[1] = (longlong)palVar18;
              alVar1[0] = (longlong)palVar21;
              alVar1[2] = (longlong)palVar22;
              alVar1[3] = (longlong)palVar19;
              parasail_memset___m256i(b,alVar1,uVar26);
              c[1] = (longlong)palVar18;
              c[0] = (longlong)palVar21;
              c[2] = (longlong)palVar22;
              c[3] = (longlong)palVar19;
              parasail_memset___m256i(b_00,c,uVar26);
              c_00[1] = (longlong)palVar18;
              c_00[0] = (longlong)palVar21;
              c_00[2] = (longlong)palVar22;
              c_00[3] = (longlong)palVar19;
              parasail_memset___m256i(b_01,c_00,uVar26);
              c_01[1] = (longlong)palVar18;
              c_01[0] = (longlong)palVar21;
              c_01[2] = (longlong)palVar22;
              c_01[3] = (longlong)palVar19;
              parasail_memset___m256i(b_02,c_01,uVar26);
              c_02[1] = (longlong)palVar18;
              c_02[0] = (longlong)palVar21;
              c_02[2] = (longlong)palVar22;
              c_02[3] = (longlong)palVar19;
              parasail_memset___m256i(b_03,c_02,uVar26);
              c_03[1] = (longlong)palVar18;
              c_03[0] = (longlong)palVar21;
              c_03[2] = (longlong)palVar22;
              c_03[3] = (longlong)palVar19;
              parasail_memset___m256i(b_04,c_03,uVar26);
              c_04[1] = (longlong)palVar18;
              c_04[0] = (longlong)palVar21;
              c_04[2] = (longlong)palVar22;
              c_04[3] = (longlong)palVar19;
              parasail_memset___m256i(b_05,c_04,uVar26);
              c_05[1] = (longlong)palVar18;
              c_05[0] = (longlong)palVar21;
              c_05[2] = (longlong)palVar22;
              c_05[3] = (longlong)palVar19;
              parasail_memset___m256i(b_06,c_05,uVar26);
              uVar10 = (uint)uVar26;
              uVar13 = uVar10 - 1;
              uVar31 = 0;
              local_1d8 = 0;
              local_208 = -0x4000000000000000;
              auVar70 = ZEXT864(0) << 0x40;
              auVar47 = ZEXT1664((undefined1  [16])0x0);
              auVar66 = ZEXT1664((undefined1  [16])0x0);
              do {
                palVar34 = b_02;
                ptr_03 = b_01;
                palVar71 = b_00;
                palVar27 = b;
                local_168 = auVar70._0_32_;
                auVar45 = auVar47._0_32_;
                lVar33 = (long)(int)(ppVar4->mapper[(byte)s2[uVar31]] * uVar10) * 0x20;
                iVar24 = (int)uVar31 + -2;
                b = palVar17;
                b_01 = palVar19;
                palVar28 = palVar21;
                palVar32 = ptr;
                b_02 = palVar20;
                b_00 = palVar18;
                if ((int)local_268 == iVar24) {
                  b = local_260;
                  b_01 = palVar22;
                  palVar28 = palVar18;
                  palVar32 = palVar20;
                  b_02 = ptr;
                  b_00 = palVar21;
                }
                ptr = palVar32;
                palVar21 = palVar28;
                alVar1 = palVar34[uVar13];
                auVar36 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar50 = vpalignr_avx2((undefined1  [32])alVar1,auVar36,8);
                alVar1 = ptr_03[uVar13];
                auVar36 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar44 = vpalignr_avx2((undefined1  [32])alVar1,auVar36,8);
                alVar1 = palVar71[uVar13];
                auVar36 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar43 = vpalignr_avx2((undefined1  [32])alVar1,auVar36,8);
                alVar1 = palVar27[uVar13];
                auVar36 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                auVar36 = vpalignr_avx2((undefined1  [32])alVar1,auVar36,8);
                auVar63 = ZEXT1664((undefined1  [16])0x0);
                auVar47 = ZEXT3264(CONCAT824(1,CONCAT816(1,CONCAT88(1,1))));
                auVar65 = ZEXT1664((undefined1  [16])0x0);
                auVar69 = ZEXT1664((undefined1  [16])0x0);
                lVar29 = 0;
                do {
                  auVar40 = *(undefined1 (*) [32])((long)*b_03 + lVar29);
                  auVar39 = *(undefined1 (*) [32])((long)*b_04 + lVar29);
                  auVar2 = *(undefined1 (*) [32])((long)*b_05 + lVar29);
                  auVar46 = *(undefined1 (*) [32])((long)*b_06 + lVar29);
                  auVar36 = vpaddq_avx2(auVar36,*(undefined1 (*) [32])
                                                 ((long)pvVar5 + lVar29 + lVar33));
                  auVar68 = vpcmpgtq_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar68 = vpand_avx2(auVar36,auVar68);
                  auVar36 = vpcmpgtq_avx2(auVar68,auVar40);
                  auVar36 = vblendvpd_avx(auVar40,auVar68,auVar36);
                  auVar67 = auVar69._0_32_;
                  auVar8 = vpcmpgtq_avx2(auVar36,auVar67);
                  auVar36 = vblendvpd_avx(auVar67,auVar36,auVar8);
                  *(undefined1 (*) [32])((long)*b + lVar29) = auVar36;
                  auVar58._0_8_ = -(ulong)(auVar36._0_8_ == auVar68._0_8_);
                  auVar58._8_8_ = -(ulong)(auVar36._8_8_ == auVar68._8_8_);
                  auVar58._16_8_ = -(ulong)(auVar36._16_8_ == auVar68._16_8_);
                  auVar58._24_8_ = -(ulong)(auVar36._24_8_ == auVar68._24_8_);
                  auVar68 = vblendvpd_avx(auVar65._0_32_,auVar39,auVar8);
                  auVar43 = vpaddq_avx2(auVar43,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar29 + lVar33));
                  auVar43 = vblendvpd_avx(auVar68,auVar43,auVar58);
                  auVar51._0_8_ = -(ulong)(auVar36._0_8_ == 0);
                  auVar51._8_8_ =
                       -(ulong)(auVar36._8_8_ == SUB648(ZEXT1664((undefined1  [16])0x0),8));
                  auVar51._16_8_ = -(ulong)(auVar36._16_8_ == 0);
                  auVar51._24_8_ = -(ulong)(auVar36._24_8_ == 0);
                  auVar68 = vpandn_avx2(auVar51,auVar43);
                  *(undefined1 (*) [32])((long)*b_00 + lVar29) = auVar68;
                  auVar43 = vblendvpd_avx(auVar63._0_32_,auVar2,auVar8);
                  auVar44 = vpaddq_avx2(auVar44,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar29 + lVar33));
                  auVar43 = vblendvpd_avx(auVar43,auVar44,auVar58);
                  auVar44 = vblendvpd_avx(auVar47._0_32_,auVar46,auVar8);
                  auVar50 = vpsubq_avx2(auVar50,_DAT_00909280);
                  auVar44 = vblendvpd_avx(auVar44,auVar50,auVar58);
                  auVar8 = vpandn_avx2(auVar51,auVar43);
                  *(undefined1 (*) [32])((long)*b_01 + lVar29) = auVar8;
                  auVar50 = vpandn_avx2(auVar51,auVar44);
                  *(undefined1 (*) [32])((long)*b_02 + lVar29) = auVar50;
                  auVar43 = vpcmpgtq_avx2(local_168,auVar68);
                  auVar43 = vblendvpd_avx(auVar68,local_168,auVar43);
                  auVar44 = vpcmpgtq_avx2(auVar43,auVar8);
                  auVar43 = vblendvpd_avx(auVar8,auVar43,auVar44);
                  auVar44 = vpcmpgtq_avx2(auVar43,auVar50);
                  local_168 = vblendvpd_avx(auVar50,auVar43,auVar44);
                  auVar43 = vpcmpgtq_avx2(auVar36,auVar66._0_32_);
                  auVar43 = vblendvpd_avx(auVar66._0_32_,auVar36,auVar43);
                  auVar66 = ZEXT3264(auVar43);
                  auVar58 = vpsubq_avx2(auVar36,auVar37);
                  auVar36 = vpsubq_avx2(auVar40,auVar38);
                  auVar51 = vpcmpgtq_avx2(auVar58,auVar36);
                  auVar36 = vblendvpd_avx(auVar36,auVar58,auVar51);
                  auVar43 = vblendvpd_avx(auVar39,auVar68,auVar51);
                  auVar44 = vblendvpd_avx(auVar2,auVar8,auVar51);
                  auVar39 = vpsubq_avx2(auVar46,_DAT_00909280);
                  auVar40 = vpcmpeqd_avx2(auVar46,auVar46);
                  auVar46 = vpsubq_avx2(auVar50,auVar40);
                  auVar50 = vblendvpd_avx(auVar39,auVar46,auVar51);
                  *(undefined1 (*) [32])((long)*b_03 + lVar29) = auVar36;
                  *(undefined1 (*) [32])((long)*b_04 + lVar29) = auVar43;
                  *(undefined1 (*) [32])((long)*b_05 + lVar29) = auVar44;
                  *(undefined1 (*) [32])((long)*b_06 + lVar29) = auVar50;
                  auVar36 = vpsubq_avx2(auVar67,auVar38);
                  auVar43 = vpcmpgtq_avx2(auVar58,auVar36);
                  auVar36 = vblendvpd_avx(auVar36,auVar58,auVar43);
                  auVar69 = ZEXT3264(auVar36);
                  auVar36 = vblendvpd_avx(auVar65._0_32_,auVar68,auVar43);
                  auVar65 = ZEXT3264(auVar36);
                  auVar36 = vblendvpd_avx(auVar63._0_32_,auVar8,auVar43);
                  auVar63 = ZEXT3264(auVar36);
                  auVar36 = vpsubq_avx2(auVar47._0_32_,auVar40);
                  auVar36 = vblendvpd_avx(auVar36,auVar46,auVar43);
                  auVar47 = ZEXT3264(auVar36);
                  auVar36 = *(undefined1 (*) [32])((long)*palVar27 + lVar29);
                  auVar43 = *(undefined1 (*) [32])((long)*palVar71 + lVar29);
                  auVar44 = *(undefined1 (*) [32])((long)*ptr_03 + lVar29);
                  auVar50 = *(undefined1 (*) [32])((long)*palVar34 + lVar29);
                  lVar29 = lVar29 + 0x20;
                } while (uVar26 << 5 != lVar29);
                auVar70 = ZEXT3264(local_168);
                if ((int)local_268 == iVar24) {
                  local_260 = palVar17;
                  palVar22 = palVar19;
                }
                iVar24 = 0;
                auVar36 = vpcmpeqd_avx2(auVar2,auVar2);
                do {
                  auVar44 = auVar63._0_32_;
                  auVar43 = vperm2f128_avx(auVar44,auVar44,8);
                  auVar43 = vpalignr_avx2(auVar44,auVar43,8);
                  auVar63 = ZEXT3264(auVar43);
                  auVar44 = auVar65._0_32_;
                  auVar43 = vperm2f128_avx(auVar44,auVar44,8);
                  auVar43 = vpalignr_avx2(auVar44,auVar43,8);
                  auVar65 = ZEXT3264(auVar43);
                  auVar43 = vpermpd_avx2(auVar47._0_32_,0x90);
                  auVar43 = vblendpd_avx(auVar43,SUB6432(ZEXT864(1),0),1);
                  auVar47 = ZEXT3264(auVar43);
                  auVar43 = vpermpd_avx2(auVar69._0_32_,0x90);
                  auVar43 = vblendpd_avx(auVar43,ZEXT832((ulong)(long)-open),1);
                  auVar69 = ZEXT3264(auVar43);
                  alVar1 = palVar27[uVar13];
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  auVar43 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,8);
                  lVar29 = 0;
                  do {
                    auVar44 = vpaddq_avx2(auVar43,*(undefined1 (*) [32])
                                                   ((long)pvVar5 + lVar29 + lVar33));
                    auVar50 = vpcmpgtq_avx2(auVar44,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar43 = *(undefined1 (*) [32])((long)*b + lVar29);
                    auVar68 = auVar69._0_32_;
                    auVar40 = vpcmpgtq_avx2(auVar43,auVar68);
                    auVar43 = vblendvpd_avx(auVar68,auVar43,auVar40);
                    auVar44 = vpand_avx2(auVar50,auVar44);
                    *(undefined1 (*) [32])((long)*b + lVar29) = auVar43;
                    auVar39._0_8_ = -(ulong)(auVar43._0_8_ == auVar44._0_8_);
                    auVar39._8_8_ = -(ulong)(auVar43._8_8_ == auVar44._8_8_);
                    auVar39._16_8_ = -(ulong)(auVar43._16_8_ == auVar44._16_8_);
                    auVar39._24_8_ = -(ulong)(auVar43._24_8_ == auVar44._24_8_);
                    auVar40 = vpor_avx2(auVar39,auVar40);
                    auVar44 = vblendvpd_avx(auVar65._0_32_,
                                            *(undefined1 (*) [32])((long)*b_00 + lVar29),auVar40);
                    *(undefined1 (*) [32])((long)*b_00 + lVar29) = auVar44;
                    auVar50 = vblendvpd_avx(auVar63._0_32_,
                                            *(undefined1 (*) [32])((long)*b_01 + lVar29),auVar40);
                    *(undefined1 (*) [32])((long)*b_01 + lVar29) = auVar50;
                    auVar40 = vblendvpd_avx(auVar47._0_32_,
                                            *(undefined1 (*) [32])((long)*b_02 + lVar29),auVar40);
                    *(undefined1 (*) [32])((long)*b_02 + lVar29) = auVar40;
                    auVar39 = vpcmpgtq_avx2(auVar70._0_32_,auVar44);
                    auVar39 = vblendvpd_avx(auVar44,auVar70._0_32_,auVar39);
                    auVar2 = vpcmpgtq_avx2(auVar39,auVar50);
                    auVar39 = vblendvpd_avx(auVar50,auVar39,auVar2);
                    auVar2 = vpcmpgtq_avx2(auVar39,auVar40);
                    auVar39 = vblendvpd_avx(auVar40,auVar39,auVar2);
                    auVar70 = ZEXT3264(auVar39);
                    auVar2 = vpcmpgtq_avx2(auVar43,auVar66._0_32_);
                    auVar2 = vblendvpd_avx(auVar66._0_32_,auVar43,auVar2);
                    auVar66 = ZEXT3264(auVar2);
                    auVar8 = vpsubq_avx2(auVar43,auVar37);
                    auVar51 = vpsubq_avx2(auVar68,auVar38);
                    auVar69 = ZEXT3264(auVar51);
                    auVar68 = vpcmpgtq_avx2(auVar51,auVar8);
                    auVar46._0_8_ = -(ulong)(auVar51._0_8_ == auVar8._0_8_);
                    auVar46._8_8_ = -(ulong)(auVar51._8_8_ == auVar8._8_8_);
                    auVar46._16_8_ = -(ulong)(auVar51._16_8_ == auVar8._16_8_);
                    auVar46._24_8_ = -(ulong)(auVar51._24_8_ == auVar8._24_8_);
                    auVar43 = vpcmpgtq_avx2(auVar51,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar43 = vpand_avx2(auVar46,auVar43);
                    auVar43 = vpor_avx2(auVar43,auVar68);
                    if ((((auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar43 >> 0x7f,0) == '\0') && SUB321(auVar43 >> 0xbf,0) == '\0') &&
                        -1 < auVar43[0x1f]) goto LAB_0079a9db;
                    auVar68 = vpcmpgtq_avx2(auVar8,auVar51);
                    auVar43 = vblendvpd_avx(auVar65._0_32_,auVar44,auVar68);
                    auVar65 = ZEXT3264(auVar43);
                    auVar43 = vblendvpd_avx(auVar63._0_32_,auVar50,auVar68);
                    auVar63 = ZEXT3264(auVar43);
                    auVar43 = vblendvpd_avx(auVar47._0_32_,auVar40,auVar68);
                    auVar43 = vpsubq_avx2(auVar43,auVar36);
                    auVar47 = ZEXT3264(auVar43);
                    auVar43 = *(undefined1 (*) [32])((long)*palVar27 + lVar29);
                    lVar29 = lVar29 + 0x20;
                  } while (uVar26 << 5 != lVar29);
                  iVar24 = iVar24 + 1;
                } while (iVar24 != 4);
LAB_0079a9db:
                auVar36 = vpcmpgtq_avx2(auVar2,auVar45);
                if ((((auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar36 >> 0x7f,0) != '\0') || SUB321(auVar36 >> 0xbf,0) != '\0') ||
                    auVar36[0x1f] < '\0') {
                  lVar33 = auVar2._0_8_;
                  if (auVar2._0_8_ < auVar2._16_8_) {
                    lVar33 = auVar2._16_8_;
                  }
                  local_208 = vpextrq_avx(auVar2._0_16_,1);
                  lVar29 = vpextrq_avx(auVar2._16_16_,1);
                  if (local_208 < lVar29) {
                    local_208 = lVar29;
                  }
                  if (local_208 <= lVar33) {
                    local_208 = lVar33;
                  }
                  if ((long)(~(long)iVar14 + 0x7fffffffffffffffU) < local_208) {
                    *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                    goto LAB_0079aa99;
                  }
                  auVar45._8_8_ = local_208;
                  auVar45._0_8_ = local_208;
                  auVar45._16_8_ = local_208;
                  auVar45._24_8_ = local_208;
                  local_268 = uVar31 & 0xffffffff;
                }
                auVar47 = ZEXT3264(auVar45);
                uVar31 = uVar31 + 1;
                palVar18 = palVar71;
                palVar19 = ptr_03;
                palVar17 = palVar27;
                palVar20 = palVar34;
              } while (uVar31 != iVar3 + 1U);
              uVar31 = (ulong)(iVar3 + 1U);
LAB_0079aa99:
              if ((local_208 == 0x7fffffffffffffff) ||
                 (auVar40._0_8_ = -(ulong)(auVar39._0_8_ == 0x7fffffffffffffff),
                 auVar40._8_8_ = -(ulong)(auVar39._8_8_ == 0x7fffffffffffffff),
                 auVar40._16_8_ = -(ulong)(auVar39._16_8_ == 0x7fffffffffffffff),
                 bVar9 = auVar39._24_8_ == 0x7fffffffffffffff, auVar40._24_8_ = -(ulong)bVar9,
                 (((auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  SUB321(auVar40 >> 0x7f,0) != '\0') || SUB321(auVar40 >> 0xbf,0) != '\0') || bVar9)
                 ) {
                *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
              }
              iVar14 = parasail_result_is_saturated(result_00);
              iVar24 = 0;
              palVar20 = palVar27;
              palVar18 = palVar71;
              palVar17 = palVar34;
              if (iVar14 == 0) {
                palVar28 = local_260;
                local_d8 = b_00;
                palVar19 = b;
                palVar32 = b_01;
                palVar11 = b_02;
                ptr_00 = palVar21;
                ptr_01 = palVar22;
                ptr_02 = ptr;
                if (((int)local_268 != (int)uVar31 + -1) &&
                   (palVar28 = b, local_d8 = palVar21, palVar19 = local_260, palVar32 = palVar22,
                   palVar11 = ptr, ptr_00 = b_00, ptr_01 = b_01, ptr_02 = b_02,
                   (int)local_268 == (int)uVar31 + -2)) {
                  palVar20 = local_260;
                  palVar18 = palVar21;
                  palVar17 = ptr;
                  local_d8 = palVar71;
                  palVar19 = palVar27;
                  palVar32 = ptr_03;
                  palVar11 = palVar34;
                  ptr_03 = palVar22;
                }
                ptr = palVar11;
                if ((uVar16 + 3 & 0x7ffffffc) == 0) {
                  iVar24 = 0;
                  iVar15 = 0;
                  iVar14 = 0;
                }
                else {
                  uVar26 = 0;
                  lVar25 = 0;
                  lVar23 = 0;
                  do {
                    if (((*palVar19)[uVar26] == local_208) &&
                       (uVar30 = ((uint)uVar26 & 3) * uVar10 + ((uint)(uVar26 >> 2) & 0x3fffffff),
                       (int)uVar30 < (int)uVar16)) {
                      local_1d8 = (*local_d8)[uVar26];
                      lVar25 = (*palVar32)[uVar26];
                      lVar23 = (*ptr)[uVar26];
                      uVar16 = (ulong)uVar30;
                    }
                    iVar15 = (int)lVar23;
                    iVar24 = (int)lVar25;
                    uVar30 = (uint)uVar16;
                    uVar26 = uVar26 + 1;
                  } while ((uVar10 & 0x1fffffff) << 2 != (int)uVar26);
                  iVar14 = (int)local_1d8;
                }
              }
              else {
                iVar15 = 0;
                iVar14 = 0;
                local_208 = 0;
                local_268._0_4_ = 0;
                uVar30 = 0;
                palVar28 = b;
                palVar32 = palVar22;
                ptr_00 = b_00;
                ptr_01 = b_01;
                ptr_02 = b_02;
                local_d8 = palVar21;
                palVar19 = local_260;
              }
              result_00->score = (int)local_208;
              result_00->end_query = uVar30;
              result_00->end_ref = (int)local_268;
              ((result_00->field_4).stats)->matches = iVar14;
              ((result_00->field_4).stats)->similar = iVar24;
              ((result_00->field_4).stats)->length = iVar15;
              parasail_free(ptr);
              parasail_free(palVar32);
              parasail_free(local_d8);
              parasail_free(palVar19);
              parasail_free(b_06);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(palVar17);
              parasail_free(ptr_02);
              parasail_free(ptr_03);
              parasail_free(ptr_01);
              parasail_free(palVar18);
              parasail_free(ptr_00);
              parasail_free(palVar20);
              parasail_free(palVar28);
            }
            else {
              result_00 = (parasail_result_t *)0x0;
            }
            goto LAB_0079adc6;
          }
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
LAB_0079adc6:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar12;
  result_00->end_ref = iVar3;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_64(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_64(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_64(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_64(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_64(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}